

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O3

void __thiscall RNG::~RNG(RNG *this)

{
  _Manager_type p_Var1;
  overflow_callback *poVar2;
  
  std::random_device::_M_fini();
  p_Var1 = (this->_generate_mark)._overflow_callback.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    poVar2 = &(this->_generate_mark)._overflow_callback;
    (*p_Var1)((_Any_data *)poVar2,(_Any_data *)poVar2,__destroy_functor);
  }
  return;
}

Assistant:

int generate(int from, int to)
    {
        Bench::Probe probe(_generate_mark);

		std::uniform_int_distribution<int> dist(from, to);
        return dist(_rd);
    }